

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::ShaderMatrixTests::init(ShaderMatrixTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int vecSize;
  int iVar2;
  DataType DVar3;
  TestNode *node;
  TestNode *pTVar4;
  char *__s;
  long *plVar5;
  ShaderMatrixCase *pSVar6;
  ulong uVar7;
  InputType IVar8;
  long *plVar9;
  size_type *psVar10;
  long lVar11;
  InputTypeSpec *pIVar12;
  ulong uVar13;
  string vecMatName;
  ShaderInput scalarIn;
  undefined4 uStack_174;
  long local_170;
  long lStack_168;
  byte local_15a;
  byte local_159;
  TestNode *local_158;
  Precision local_14c;
  ulong local_148;
  TestNode *local_140;
  char local_136;
  char local_135;
  ShaderInput matIn;
  string baseName;
  ShaderInput otherMatIn;
  undefined4 uStack_f4;
  long local_f0;
  long lStack_e8;
  InputType local_e0;
  DataType local_dc;
  allocator<char> local_d5;
  int local_d4;
  char *local_d0;
  uint local_c8;
  InputType local_c4;
  ShaderInput rowVecIn;
  ShaderInput colVecIn;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long local_70;
  ulong local_68;
  long local_60;
  long local_58;
  long *local_50 [2];
  long local_40 [2];
  
  lVar11 = 0;
  local_140 = (TestNode *)this;
  do {
    pIVar12 = init::reducedInputTypes;
    local_136 = init::ops[lVar11].extendedInputTypeCases;
    if ((bool)local_136 != false) {
      pIVar12 = init::extendedInputTypes;
    }
    local_148 = (ulong)init::ops[lVar11].op;
    local_70 = lVar11;
    node = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,((TestNode *)this)->m_testCtx,init::ops[lVar11].name,
               init::ops[lVar11].desc);
    tcu::TestNode::addChild((TestNode *)this,node);
    local_135 = init::ops[lVar11].createInputTypeGroup;
    local_c4 = ((int)local_148 != 3) + INPUTTYPE_UNIFORM;
    local_c8 = (int)local_148 - 7;
    uVar7 = 0;
    uVar13 = local_148;
    do {
      local_e0 = pIVar12[uVar7].type;
      local_158 = node;
      local_68 = uVar7;
      if (local_135 != '\0') {
        pTVar4 = (TestNode *)operator_new(0x70);
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)pTVar4,((TestNode *)this)->m_testCtx,pIVar12[uVar7].name,
                   pIVar12[uVar7].desc);
        local_158 = pTVar4;
        tcu::TestNode::addChild(node,pTVar4);
      }
      IVar8 = local_e0;
      if (local_e0 == INPUTTYPE_DYNAMIC) {
        IVar8 = INPUTTYPE_UNIFORM;
      }
      lVar11 = 0;
      do {
        local_15a = (int)uVar13 == 0x11;
        local_159 = local_c8 < 2;
        DVar3 = init::matrixTypes[lVar11];
        local_60 = lVar11;
        vecSize = glu::getDataTypeMatrixNumColumns(DVar3);
        iVar2 = glu::getDataTypeMatrixNumRows(DVar3);
        local_dc = DVar3;
        local_d0 = glu::getDataTypeName(DVar3);
        local_159 = local_159 & vecSize == iVar2;
        local_15a = local_15a & vecSize == iVar2;
        lVar11 = 0;
        local_d4 = iVar2;
        do {
          local_14c = init::precisions[lVar11];
          local_58 = lVar11;
          __s = glu::getPrecisionName(local_14c);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&otherMatIn,__s,(allocator<char> *)&local_90);
          plVar5 = (long *)std::__cxx11::string::append((char *)&otherMatIn);
          scalarIn._0_8_ = &local_170;
          plVar9 = plVar5 + 2;
          if ((long *)*plVar5 == plVar9) {
            local_170 = *plVar9;
            lStack_168 = plVar5[3];
          }
          else {
            local_170 = *plVar9;
            scalarIn._0_8_ = (long *)*plVar5;
          }
          unique0x00012000 = plVar5[1];
          *plVar5 = (long)plVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&scalarIn);
          vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
          psVar10 = (size_type *)(plVar5 + 2);
          if ((size_type *)*plVar5 == psVar10) {
            vecMatName.field_2._M_allocated_capacity = *psVar10;
            vecMatName.field_2._8_8_ = plVar5[3];
          }
          else {
            vecMatName.field_2._M_allocated_capacity = *psVar10;
            vecMatName._M_dataplus._M_p = (pointer)*plVar5;
          }
          vecMatName._M_string_length = plVar5[1];
          *plVar5 = (long)psVar10;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&vecMatName);
          baseName._M_dataplus._M_p = (pointer)&baseName.field_2;
          psVar10 = (size_type *)(plVar5 + 2);
          if ((size_type *)*plVar5 == psVar10) {
            baseName.field_2._M_allocated_capacity = *psVar10;
            baseName.field_2._8_8_ = plVar5[3];
          }
          else {
            baseName.field_2._M_allocated_capacity = *psVar10;
            baseName._M_dataplus._M_p = (pointer)*plVar5;
          }
          baseName._M_string_length = plVar5[1];
          *plVar5 = (long)psVar10;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
            operator_delete(vecMatName._M_dataplus._M_p,vecMatName.field_2._M_allocated_capacity + 1
                           );
          }
          if ((long *)scalarIn._0_8_ != &local_170) {
            operator_delete((void *)scalarIn._0_8_,local_170 + 1);
          }
          if ((long *)otherMatIn._0_8_ != &local_f0) {
            operator_delete((void *)otherMatIn._0_8_,local_f0 + 1);
          }
          matIn.inputType = local_e0;
          matIn.dataType = local_dc;
          matIn.precision = local_14c;
          if ((uint)local_148 < 4) {
            scalarIn.dataType = TYPE_FLOAT;
            scalarIn.inputType = local_c4;
            stack0xfffffffffffffe88 = CONCAT44(uStack_174,local_14c);
            pSVar6 = (ShaderMatrixCase *)operator_new(0x168);
            pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
            vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&vecMatName,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&vecMatName);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pCVar1,vecMatName._M_dataplus._M_p,"Matrix-scalar case",&matIn,
                       &scalarIn,(MatrixOp)local_148,true);
            tcu::TestNode::addChild(local_158,(TestNode *)pSVar6);
            pTVar4 = local_140;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
            pSVar6 = (ShaderMatrixCase *)operator_new(0x168);
            pCVar1 = (Context *)pTVar4[1]._vptr_TestNode;
            vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&vecMatName,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&vecMatName);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pCVar1,vecMatName._M_dataplus._M_p,"Matrix-scalar case",&matIn,
                       &scalarIn,(MatrixOp)local_148,false);
            tcu::TestNode::addChild(local_158,(TestNode *)pSVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
            pTVar4 = local_140;
            this = (ShaderMatrixTests *)local_140;
            if ((int)local_148 == 2) {
              DVar3 = glu::getDataTypeFloatVec(vecSize);
              colVecIn.inputType = INPUTTYPE_DYNAMIC;
              colVecIn.precision = local_14c;
              colVecIn.dataType = DVar3;
              pSVar6 = (ShaderMatrixCase *)operator_new(0x168);
              pCVar1 = (Context *)pTVar4[1]._vptr_TestNode;
              glu::getDataTypeName(DVar3);
              scalarIn._0_8_ = &local_170;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&scalarIn,baseName._M_dataplus._M_p,
                         baseName._M_dataplus._M_p + baseName._M_string_length);
              std::__cxx11::string::append((char *)&scalarIn);
              plVar5 = (long *)std::__cxx11::string::append((char *)&scalarIn);
              vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
              psVar10 = (size_type *)(plVar5 + 2);
              if ((size_type *)*plVar5 == psVar10) {
                vecMatName.field_2._M_allocated_capacity = *psVar10;
                vecMatName.field_2._8_8_ = plVar5[3];
              }
              else {
                vecMatName.field_2._M_allocated_capacity = *psVar10;
                vecMatName._M_dataplus._M_p = (pointer)*plVar5;
              }
              vecMatName._M_string_length = plVar5[1];
              *plVar5 = (long)psVar10;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar6,pCVar1,vecMatName._M_dataplus._M_p,"Matrix-vector case",&matIn,
                         &colVecIn,OP_MUL,true);
              tcu::TestNode::addChild(local_158,(TestNode *)pSVar6);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
                operator_delete(vecMatName._M_dataplus._M_p,
                                vecMatName.field_2._M_allocated_capacity + 1);
              }
              pTVar4 = local_140;
              if ((long *)scalarIn._0_8_ != &local_170) {
                operator_delete((void *)scalarIn._0_8_,local_170 + 1);
              }
              pSVar6 = (ShaderMatrixCase *)operator_new(0x168);
              pCVar1 = (Context *)pTVar4[1]._vptr_TestNode;
              glu::getDataTypeName(DVar3);
              scalarIn._0_8_ = &local_170;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&scalarIn,baseName._M_dataplus._M_p,
                         baseName._M_dataplus._M_p + baseName._M_string_length);
              std::__cxx11::string::append((char *)&scalarIn);
              plVar5 = (long *)std::__cxx11::string::append((char *)&scalarIn);
              vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
              psVar10 = (size_type *)(plVar5 + 2);
              if ((size_type *)*plVar5 == psVar10) {
                vecMatName.field_2._M_allocated_capacity = *psVar10;
                vecMatName.field_2._8_8_ = plVar5[3];
              }
              else {
                vecMatName.field_2._M_allocated_capacity = *psVar10;
                vecMatName._M_dataplus._M_p = (pointer)*plVar5;
              }
              vecMatName._M_string_length = plVar5[1];
              *plVar5 = (long)psVar10;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar6,pCVar1,vecMatName._M_dataplus._M_p,"Matrix-vector case",&matIn,
                         &colVecIn,OP_MUL,false);
              tcu::TestNode::addChild(local_158,(TestNode *)pSVar6);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
                operator_delete(vecMatName._M_dataplus._M_p,
                                vecMatName.field_2._M_allocated_capacity + 1);
              }
              if ((long *)scalarIn._0_8_ != &local_170) {
                operator_delete((void *)scalarIn._0_8_,local_170 + 1);
              }
              DVar3 = glu::getDataTypeFloatVec(local_d4);
              rowVecIn.inputType = INPUTTYPE_DYNAMIC;
              rowVecIn.precision = local_14c;
              rowVecIn.dataType = DVar3;
              std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_d5);
              plVar5 = (long *)std::__cxx11::string::append((char *)local_50);
              plVar9 = plVar5 + 2;
              if ((long *)*plVar5 == plVar9) {
                local_80 = *plVar9;
                lStack_78 = plVar5[3];
                local_90 = &local_80;
              }
              else {
                local_80 = *plVar9;
                local_90 = (long *)*plVar5;
              }
              local_88 = plVar5[1];
              *plVar5 = (long)plVar9;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              glu::getDataTypeName(DVar3);
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
              plVar9 = plVar5 + 2;
              if ((long *)*plVar5 == plVar9) {
                local_f0 = *plVar9;
                lStack_e8 = plVar5[3];
                otherMatIn._0_8_ = &local_f0;
              }
              else {
                local_f0 = *plVar9;
                otherMatIn._0_8_ = (long *)*plVar5;
              }
              unique0x00012000 = plVar5[1];
              *plVar5 = (long)plVar9;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              plVar5 = (long *)std::__cxx11::string::append((char *)&otherMatIn);
              scalarIn._0_8_ = &local_170;
              plVar9 = plVar5 + 2;
              if ((long *)*plVar5 == plVar9) {
                local_170 = *plVar9;
                lStack_168 = plVar5[3];
              }
              else {
                local_170 = *plVar9;
                scalarIn._0_8_ = (long *)*plVar5;
              }
              unique0x00012000 = plVar5[1];
              *plVar5 = (long)plVar9;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              plVar5 = (long *)std::__cxx11::string::append((char *)&scalarIn);
              vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
              psVar10 = (size_type *)(plVar5 + 2);
              if ((size_type *)*plVar5 == psVar10) {
                vecMatName.field_2._M_allocated_capacity = *psVar10;
                vecMatName.field_2._8_8_ = plVar5[3];
              }
              else {
                vecMatName.field_2._M_allocated_capacity = *psVar10;
                vecMatName._M_dataplus._M_p = (pointer)*plVar5;
              }
              vecMatName._M_string_length = plVar5[1];
              *plVar5 = (long)psVar10;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              if ((long *)scalarIn._0_8_ != &local_170) {
                operator_delete((void *)scalarIn._0_8_,local_170 + 1);
              }
              if ((long *)otherMatIn._0_8_ != &local_f0) {
                operator_delete((void *)otherMatIn._0_8_,local_f0 + 1);
              }
              if (local_90 != &local_80) {
                operator_delete(local_90,local_80 + 1);
              }
              if (local_50[0] != local_40) {
                operator_delete(local_50[0],local_40[0] + 1);
              }
              pSVar6 = (ShaderMatrixCase *)operator_new(0x168);
              pCVar1 = (Context *)local_140[1]._vptr_TestNode;
              scalarIn._0_8_ = &local_170;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&scalarIn,vecMatName._M_dataplus._M_p,
                         vecMatName._M_dataplus._M_p + vecMatName._M_string_length);
              std::__cxx11::string::append((char *)&scalarIn);
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar6,pCVar1,(char *)scalarIn._0_8_,"Vector-matrix case",&rowVecIn,&matIn,
                         OP_MUL,true);
              tcu::TestNode::addChild(local_158,(TestNode *)pSVar6);
              pTVar4 = local_140;
              if ((long *)scalarIn._0_8_ != &local_170) {
                operator_delete((void *)scalarIn._0_8_,local_170 + 1);
              }
              pSVar6 = (ShaderMatrixCase *)operator_new(0x168);
              pCVar1 = (Context *)pTVar4[1]._vptr_TestNode;
              scalarIn._0_8_ = &local_170;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&scalarIn,vecMatName._M_dataplus._M_p,
                         vecMatName._M_dataplus._M_p + vecMatName._M_string_length);
              std::__cxx11::string::append((char *)&scalarIn);
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar6,pCVar1,(char *)scalarIn._0_8_,"Vector-matrix case",&rowVecIn,&matIn,
                         OP_MUL,false);
              tcu::TestNode::addChild(local_158,(TestNode *)pSVar6);
              if ((long *)scalarIn._0_8_ != &local_170) {
                operator_delete((void *)scalarIn._0_8_,local_170 + 1);
              }
              this = (ShaderMatrixTests *)local_140;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
                operator_delete(vecMatName._M_dataplus._M_p,
                                vecMatName.field_2._M_allocated_capacity + 1);
              }
              iVar2 = 2;
              do {
                DVar3 = glu::getDataTypeMatrix(iVar2,vecSize);
                otherMatIn.dataType = DVar3;
                otherMatIn.inputType = IVar8;
                stack0xffffffffffffff08 = CONCAT44(uStack_f4,local_14c);
                pSVar6 = (ShaderMatrixCase *)operator_new(0x168);
                pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
                glu::getDataTypeName(DVar3);
                scalarIn._0_8_ = &local_170;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&scalarIn,baseName._M_dataplus._M_p,
                           baseName._M_dataplus._M_p + baseName._M_string_length);
                std::__cxx11::string::append((char *)&scalarIn);
                plVar5 = (long *)std::__cxx11::string::append((char *)&scalarIn);
                vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
                psVar10 = (size_type *)(plVar5 + 2);
                if ((size_type *)*plVar5 == psVar10) {
                  vecMatName.field_2._M_allocated_capacity = *psVar10;
                  vecMatName.field_2._8_8_ = plVar5[3];
                }
                else {
                  vecMatName.field_2._M_allocated_capacity = *psVar10;
                  vecMatName._M_dataplus._M_p = (pointer)*plVar5;
                }
                vecMatName._M_string_length = plVar5[1];
                *plVar5 = (long)psVar10;
                plVar5[1] = 0;
                *(undefined1 *)(plVar5 + 2) = 0;
                ShaderMatrixCase::ShaderMatrixCase
                          (pSVar6,pCVar1,vecMatName._M_dataplus._M_p,"Matrix-matrix case",&matIn,
                           &otherMatIn,OP_MUL,true);
                tcu::TestNode::addChild(local_158,(TestNode *)pSVar6);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
                  operator_delete(vecMatName._M_dataplus._M_p,
                                  vecMatName.field_2._M_allocated_capacity + 1);
                }
                pTVar4 = local_140;
                if ((long *)scalarIn._0_8_ != &local_170) {
                  operator_delete((void *)scalarIn._0_8_,local_170 + 1);
                }
                pSVar6 = (ShaderMatrixCase *)operator_new(0x168);
                pCVar1 = (Context *)pTVar4[1]._vptr_TestNode;
                glu::getDataTypeName(DVar3);
                scalarIn._0_8_ = &local_170;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&scalarIn,baseName._M_dataplus._M_p,
                           baseName._M_dataplus._M_p + baseName._M_string_length);
                std::__cxx11::string::append((char *)&scalarIn);
                plVar5 = (long *)std::__cxx11::string::append((char *)&scalarIn);
                vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
                psVar10 = (size_type *)(plVar5 + 2);
                if ((size_type *)*plVar5 == psVar10) {
                  vecMatName.field_2._M_allocated_capacity = *psVar10;
                  vecMatName.field_2._8_8_ = plVar5[3];
                }
                else {
                  vecMatName.field_2._M_allocated_capacity = *psVar10;
                  vecMatName._M_dataplus._M_p = (pointer)*plVar5;
                }
                vecMatName._M_string_length = plVar5[1];
                *plVar5 = (long)psVar10;
                plVar5[1] = 0;
                *(undefined1 *)(plVar5 + 2) = 0;
                ShaderMatrixCase::ShaderMatrixCase
                          (pSVar6,pCVar1,vecMatName._M_dataplus._M_p,"Matrix-matrix case",&matIn,
                           &otherMatIn,OP_MUL,false);
                tcu::TestNode::addChild(local_158,(TestNode *)pSVar6);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
                  operator_delete(vecMatName._M_dataplus._M_p,
                                  vecMatName.field_2._M_allocated_capacity + 1);
                }
                this = (ShaderMatrixTests *)local_140;
                if ((long *)scalarIn._0_8_ != &local_170) {
                  operator_delete((void *)scalarIn._0_8_,local_170 + 1);
                }
                iVar2 = iVar2 + 1;
              } while (iVar2 != 5);
            }
            else {
switchD_0047f54f_caseD_4:
              otherMatIn.dataType = local_dc;
              otherMatIn.inputType = IVar8;
              stack0xffffffffffffff08 = CONCAT44(uStack_f4,local_14c);
              pSVar6 = (ShaderMatrixCase *)operator_new(0x168);
              pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
              scalarIn._0_8_ = &local_170;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&scalarIn,baseName._M_dataplus._M_p,
                         baseName._M_dataplus._M_p + baseName._M_string_length);
              std::__cxx11::string::append((char *)&scalarIn);
              plVar5 = (long *)std::__cxx11::string::append((char *)&scalarIn);
              vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
              psVar10 = (size_type *)(plVar5 + 2);
              if ((size_type *)*plVar5 == psVar10) {
                vecMatName.field_2._M_allocated_capacity = *psVar10;
                vecMatName.field_2._8_8_ = plVar5[3];
              }
              else {
                vecMatName.field_2._M_allocated_capacity = *psVar10;
                vecMatName._M_dataplus._M_p = (pointer)*plVar5;
              }
              vecMatName._M_string_length = plVar5[1];
              *plVar5 = (long)psVar10;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar6,pCVar1,vecMatName._M_dataplus._M_p,"Matrix-matrix case",&matIn,
                         &otherMatIn,(MatrixOp)local_148,true);
              tcu::TestNode::addChild(local_158,(TestNode *)pSVar6);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
                operator_delete(vecMatName._M_dataplus._M_p,
                                vecMatName.field_2._M_allocated_capacity + 1);
              }
              pTVar4 = local_140;
              if ((long *)scalarIn._0_8_ != &local_170) {
                operator_delete((void *)scalarIn._0_8_,local_170 + 1);
              }
              pSVar6 = (ShaderMatrixCase *)operator_new(0x168);
              pCVar1 = (Context *)pTVar4[1]._vptr_TestNode;
              scalarIn._0_8_ = &local_170;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&scalarIn,baseName._M_dataplus._M_p,
                         baseName._M_dataplus._M_p + baseName._M_string_length);
              std::__cxx11::string::append((char *)&scalarIn);
              plVar5 = (long *)std::__cxx11::string::append((char *)&scalarIn);
              vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
              psVar10 = (size_type *)(plVar5 + 2);
              if ((size_type *)*plVar5 == psVar10) {
                vecMatName.field_2._M_allocated_capacity = *psVar10;
                vecMatName.field_2._8_8_ = plVar5[3];
              }
              else {
                vecMatName.field_2._M_allocated_capacity = *psVar10;
                vecMatName._M_dataplus._M_p = (pointer)*plVar5;
              }
              vecMatName._M_string_length = plVar5[1];
              *plVar5 = (long)psVar10;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar6,pCVar1,vecMatName._M_dataplus._M_p,"Matrix-matrix case",&matIn,
                         &otherMatIn,(MatrixOp)local_148,false);
              tcu::TestNode::addChild(local_158,(TestNode *)pSVar6);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
                operator_delete(vecMatName._M_dataplus._M_p,
                                vecMatName.field_2._M_allocated_capacity + 1);
              }
              this = (ShaderMatrixTests *)local_140;
              if ((long *)scalarIn._0_8_ != &local_170) {
                operator_delete((void *)scalarIn._0_8_,local_170 + 1);
              }
            }
switchD_0047f54f_caseD_7:
            if (local_159 != 0) {
switchD_0047f54f_caseD_6:
              scalarIn.inputType = INPUTTYPE_LAST;
              scalarIn.dataType = TYPE_LAST;
              stack0xfffffffffffffe88 = CONCAT44(uStack_174,3);
              pSVar6 = (ShaderMatrixCase *)operator_new(0x168);
              pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
              vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&vecMatName,baseName._M_dataplus._M_p,
                         baseName._M_dataplus._M_p + baseName._M_string_length);
              std::__cxx11::string::append((char *)&vecMatName);
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar6,pCVar1,vecMatName._M_dataplus._M_p,"Matrix case",&matIn,&scalarIn,
                         (MatrixOp)local_148,true);
              tcu::TestNode::addChild(local_158,(TestNode *)pSVar6);
              pTVar4 = local_140;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
                operator_delete(vecMatName._M_dataplus._M_p,
                                vecMatName.field_2._M_allocated_capacity + 1);
              }
              pSVar6 = (ShaderMatrixCase *)operator_new(0x168);
              pCVar1 = (Context *)pTVar4[1]._vptr_TestNode;
              vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&vecMatName,baseName._M_dataplus._M_p,
                         baseName._M_dataplus._M_p + baseName._M_string_length);
              std::__cxx11::string::append((char *)&vecMatName);
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar6,pCVar1,vecMatName._M_dataplus._M_p,"Matrix case",&matIn,&scalarIn,
                         (MatrixOp)local_148,false);
              tcu::TestNode::addChild(local_158,(TestNode *)pSVar6);
              this = (ShaderMatrixTests *)local_140;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
                operator_delete(vecMatName._M_dataplus._M_p,
                                vecMatName.field_2._M_allocated_capacity + 1);
                this = (ShaderMatrixTests *)local_140;
              }
            }
            if ((0x12 < (uint)local_148) || ((0x58000U >> ((uint)local_148 & 0x1f) & 1) == 0))
            goto LAB_00480492;
LAB_0048012e:
            scalarIn.dataType = local_dc;
            scalarIn.inputType = IVar8;
            stack0xfffffffffffffe88 = CONCAT44(uStack_174,local_14c);
            pSVar6 = (ShaderMatrixCase *)operator_new(0x168);
            pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
            vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&vecMatName,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&vecMatName);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pCVar1,vecMatName._M_dataplus._M_p,"Matrix assignment case",&matIn,
                       &scalarIn,(MatrixOp)local_148,true);
            tcu::TestNode::addChild(local_158,(TestNode *)pSVar6);
            pTVar4 = local_140;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
            pSVar6 = (ShaderMatrixCase *)operator_new(0x168);
            pCVar1 = (Context *)pTVar4[1]._vptr_TestNode;
            vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&vecMatName,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&vecMatName);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pCVar1,vecMatName._M_dataplus._M_p,"Matrix assignment case",&matIn,
                       &scalarIn,(MatrixOp)local_148,false);
            tcu::TestNode::addChild(local_158,(TestNode *)pSVar6);
            this = (ShaderMatrixTests *)local_140;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
              this = (ShaderMatrixTests *)local_140;
            }
          }
          else {
            switch((uint)local_148) {
            case 4:
              goto switchD_0047f54f_caseD_4;
            case 5:
              scalarIn.dataType = glu::getDataTypeFloatVec(local_d4);
              scalarIn.inputType = local_e0;
              stack0xfffffffffffffe88 = CONCAT44(uStack_174,local_14c);
              otherMatIn.dataType = glu::getDataTypeFloatVec(vecSize);
              otherMatIn.inputType = IVar8;
              stack0xffffffffffffff08 = CONCAT44(uStack_f4,local_14c);
              pSVar6 = (ShaderMatrixCase *)operator_new(0x168);
              pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
              vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&vecMatName,baseName._M_dataplus._M_p,
                         baseName._M_dataplus._M_p + baseName._M_string_length);
              std::__cxx11::string::append((char *)&vecMatName);
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar6,pCVar1,vecMatName._M_dataplus._M_p,"Vector-vector case",&scalarIn,
                         &otherMatIn,(MatrixOp)local_148,true);
              tcu::TestNode::addChild(local_158,(TestNode *)pSVar6);
              pTVar4 = local_140;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
                operator_delete(vecMatName._M_dataplus._M_p,
                                vecMatName.field_2._M_allocated_capacity + 1);
              }
              pSVar6 = (ShaderMatrixCase *)operator_new(0x168);
              pCVar1 = (Context *)pTVar4[1]._vptr_TestNode;
              vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&vecMatName,baseName._M_dataplus._M_p,
                         baseName._M_dataplus._M_p + baseName._M_string_length);
              std::__cxx11::string::append((char *)&vecMatName);
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar6,pCVar1,vecMatName._M_dataplus._M_p,"Vector-vector case",&scalarIn,
                         &otherMatIn,(MatrixOp)local_148,false);
              tcu::TestNode::addChild(local_158,(TestNode *)pSVar6);
              this = (ShaderMatrixTests *)local_140;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
                operator_delete(vecMatName._M_dataplus._M_p,
                                vecMatName.field_2._M_allocated_capacity + 1);
                this = (ShaderMatrixTests *)local_140;
              }
              break;
            case 6:
            case 9:
            case 10:
            case 0xb:
            case 0xc:
            case 0xd:
            case 0xe:
              goto switchD_0047f54f_caseD_6;
            default:
              goto switchD_0047f54f_caseD_7;
            }
LAB_00480492:
            if (local_15a != 0) goto LAB_0048012e;
          }
          uVar13 = local_148;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)baseName._M_dataplus._M_p != &baseName.field_2) {
            operator_delete(baseName._M_dataplus._M_p,baseName.field_2._M_allocated_capacity + 1);
          }
          lVar11 = local_58 + 1;
        } while (lVar11 != 3);
        lVar11 = local_60 + 1;
      } while (lVar11 != 9);
    } while ((local_68 < 2) && (uVar7 = local_68 + 1, local_136 != '\0'));
    lVar11 = local_70 + 1;
    if (lVar11 == 0x13) {
      return 0x13;
    }
  } while( true );
}

Assistant:

void ShaderMatrixTests::init (void)
{
	static const struct
	{
		const char*		name;
		const char*		desc;
		MatrixOp		op;
		bool			extendedInputTypeCases; // !< test with const and uniform types too
		bool			createInputTypeGroup;	// !< create group for input types
	} ops[] =
	{
		{ "add",			"Matrix addition tests",						OP_ADD,				true,	true	},
		{ "sub",			"Matrix subtraction tests",						OP_SUB,				true,	true	},
		{ "mul",			"Matrix multiplication tests",					OP_MUL,				true,	true	},
		{ "div",			"Matrix division tests",						OP_DIV,				true,	true	},
		{ "matrixcompmult",	"Matrix component-wise multiplication tests",	OP_COMP_MUL,		false,	true	},
		{ "outerproduct",	"Matrix outerProduct() tests",					OP_OUTER_PRODUCT,	false,	true	},
		{ "transpose",		"Matrix transpose() tests",						OP_TRANSPOSE,		false,	true	},
		{ "determinant",	"Matrix determinant() tests",					OP_DETERMINANT,		false,	true	},
		{ "inverse",		"Matrix inverse() tests",						OP_INVERSE,			false,	true	},
		{ "unary_addition",	"Matrix unary addition tests",					OP_UNARY_PLUS,		false,	false	},
		{ "negation",		"Matrix negation tests",						OP_NEGATION,		false,	false	},
		{ "pre_increment",	"Matrix prefix increment tests",				OP_PRE_INCREMENT,	false,	false	},
		{ "pre_decrement",	"Matrix prefix decrement tests",				OP_PRE_DECREMENT,	false,	false	},
		{ "post_increment",	"Matrix postfix increment tests",				OP_POST_INCREMENT,	false,	false	},
		{ "post_decrement",	"Matrix postfix decrement tests",				OP_POST_DECREMENT,	false,	false	},
		{ "add_assign",		"Matrix add into tests",						OP_ADD_INTO,		false,	false	},
		{ "sub_assign",		"Matrix subtract from tests",					OP_SUBTRACT_FROM,	false,	false	},
		{ "mul_assign",		"Matrix multiply into tests",					OP_MULTIPLY_INTO,	false,	false	},
		{ "div_assign",		"Matrix divide into tests",						OP_DIVIDE_INTO,		false,	false	},
	};

	struct InputTypeSpec
	{
		const char*		name;
		const char*		desc;
		InputType		type;
	};
	static const InputTypeSpec extendedInputTypes[] =
	{
		{ "const",		"Constant matrix input",	INPUTTYPE_CONST		},
		{ "uniform",	"Uniform matrix input",		INPUTTYPE_UNIFORM	},
		{ "dynamic",	"Dynamic matrix input",		INPUTTYPE_DYNAMIC	}
	};
	static const InputTypeSpec reducedInputTypes[] =
	{
		{ "dynamic",	"Dynamic matrix input",		INPUTTYPE_DYNAMIC	}
	};

	static const DataType matrixTypes[] =
	{
		TYPE_FLOAT_MAT2,
		TYPE_FLOAT_MAT2X3,
		TYPE_FLOAT_MAT2X4,
		TYPE_FLOAT_MAT3X2,
		TYPE_FLOAT_MAT3,
		TYPE_FLOAT_MAT3X4,
		TYPE_FLOAT_MAT4X2,
		TYPE_FLOAT_MAT4X3,
		TYPE_FLOAT_MAT4
	};

	static const Precision precisions[] =
	{
		PRECISION_LOWP,
		PRECISION_MEDIUMP,
		PRECISION_HIGHP
	};

	for (int opNdx = 0; opNdx < DE_LENGTH_OF_ARRAY(ops); opNdx++)
	{
		const InputTypeSpec*	inTypeList		= (ops[opNdx].extendedInputTypeCases) ? (extendedInputTypes) : (reducedInputTypes);
		const int				inTypeListSize	= (ops[opNdx].extendedInputTypeCases) ? (DE_LENGTH_OF_ARRAY(extendedInputTypes)) : (DE_LENGTH_OF_ARRAY(reducedInputTypes));
		const MatrixOp			op				= ops[opNdx].op;
		tcu::TestCaseGroup*		opGroup			= new tcu::TestCaseGroup(m_testCtx, ops[opNdx].name, ops[opNdx].desc);

		addChild(opGroup);

		for (int inTypeNdx = 0; inTypeNdx < inTypeListSize; inTypeNdx++)
		{
			const InputType		inputType	= inTypeList[inTypeNdx].type;
			tcu::TestCaseGroup* inGroup;

			if (ops[opNdx].createInputTypeGroup)
			{
				inGroup = new tcu::TestCaseGroup(m_testCtx, inTypeList[inTypeNdx].name, inTypeList[inTypeNdx].desc);
				opGroup->addChild(inGroup);
			}
			else
				inGroup = opGroup;

			for (int matTypeNdx = 0; matTypeNdx < DE_LENGTH_OF_ARRAY(matrixTypes); matTypeNdx++)
			{
				DataType	matType		= matrixTypes[matTypeNdx];
				int			numCols		= getDataTypeMatrixNumColumns(matType);
				int			numRows		= getDataTypeMatrixNumRows(matType);
				const char*	matTypeName	= getDataTypeName(matType);

				for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
				{
					Precision	precision	= precisions[precNdx];
					const char*	precName	= getPrecisionName(precision);
					string		baseName	= string(precName) + "_" + matTypeName + "_";
					ShaderInput	matIn		(inputType, matType, precision);

					if (isOperationMatrixScalar(op))
					{
						// Matrix-scalar \note For div cases we use uniform input.
						ShaderInput scalarIn(op == OP_DIV ? INPUTTYPE_UNIFORM : INPUTTYPE_DYNAMIC, TYPE_FLOAT, precision);
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_vertex").c_str(),		"Matrix-scalar case", matIn, scalarIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_fragment").c_str(),	"Matrix-scalar case", matIn, scalarIn, op, false));
					}

					if (isOperationMatrixVector(op))
					{
						// Matrix-vector.
						DataType	colVecType	= getDataTypeFloatVec(numCols);
						ShaderInput colVecIn	(op == OP_DIV ? INPUTTYPE_UNIFORM : INPUTTYPE_DYNAMIC, colVecType, precision);

						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + getDataTypeName(colVecType) + "_vertex").c_str(),		"Matrix-vector case", matIn, colVecIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + getDataTypeName(colVecType) + "_fragment").c_str(),	"Matrix-vector case", matIn, colVecIn, op, false));

						// Vector-matrix.
						DataType	rowVecType	= getDataTypeFloatVec(numRows);
						ShaderInput	rowVecIn	(op == OP_DIV ? INPUTTYPE_UNIFORM : INPUTTYPE_DYNAMIC, rowVecType, precision);
						string		vecMatName	= string(precName) + "_" + getDataTypeName(rowVecType) + "_" + matTypeName;

						inGroup->addChild(new ShaderMatrixCase(m_context, (vecMatName + "_vertex").c_str(),		"Vector-matrix case", rowVecIn, matIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_context, (vecMatName + "_fragment").c_str(),	"Vector-matrix case", rowVecIn, matIn, op, false));
					}

					if (isOperationArithmeticMatrixMatrix(op))
					{
						// Arithmetic matrix-matrix multiplication.
						for (int otherCols = 2; otherCols <= 4; otherCols++)
						{
							ShaderInput otherMatIn(inputType == INPUTTYPE_DYNAMIC ? INPUTTYPE_UNIFORM : inputType, getDataTypeMatrix(otherCols, numCols /* rows */), precision);
							inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + getDataTypeName(otherMatIn.dataType) + "_vertex").c_str(),	"Matrix-matrix case", matIn, otherMatIn, op, true));
							inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + getDataTypeName(otherMatIn.dataType) + "_fragment").c_str(),	"Matrix-matrix case", matIn, otherMatIn, op, false));
						}
					}
					else if (isOperationComponentwiseMatrixMatrix(op))
					{
						// Component-wise.
						ShaderInput otherMatIn(inputType == INPUTTYPE_DYNAMIC ? INPUTTYPE_UNIFORM : inputType, matType, precision);
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + matTypeName + "_vertex").c_str(),		"Matrix-matrix case", matIn, otherMatIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + matTypeName + "_fragment").c_str(),	"Matrix-matrix case", matIn, otherMatIn, op, false));
					}

					if (isOperationVectorVector(op))
					{
						ShaderInput vec1In(inputType,																getDataTypeFloatVec(numRows), precision);
						ShaderInput vec2In((inputType == INPUTTYPE_DYNAMIC) ? (INPUTTYPE_UNIFORM) : (inputType),	getDataTypeFloatVec(numCols), precision);

						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_vertex").c_str(),		"Vector-vector case", vec1In, vec2In, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_fragment").c_str(),	"Vector-vector case", vec1In, vec2In, op, false));
					}

					if ((isOperationUnaryAnyMatrix(op)) ||
						(isOperationUnarySymmetricMatrix(op) && numCols == numRows))
					{
						ShaderInput voidInput(INPUTTYPE_LAST, TYPE_LAST, PRECISION_LAST);
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_vertex").c_str(),		"Matrix case", matIn, voidInput, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_fragment").c_str(),	"Matrix case", matIn, voidInput, op, false));
					}

					if ((isOperationAssignmentAnyMatrix(op)) ||
						(isOperationAssignmentSymmetricMatrix(op) && numCols == numRows))
					{
						ShaderInput otherMatIn(inputType == INPUTTYPE_DYNAMIC ? INPUTTYPE_UNIFORM : inputType, matType, precision);
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_vertex").c_str(),		"Matrix assignment case", matIn, otherMatIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_fragment").c_str(),	"Matrix assignment case", matIn, otherMatIn, op, false));
					}
				}
			}
		}
	}
}